

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

unsigned_long_long duckdb_zstd::ZSTD_decompressBound(void *src,size_t srcSize)

{
  unsigned_long_long uVar1;
  ZSTD_frameSizeInfo frameSizeInfo;
  
  uVar1 = 0;
  while( true ) {
    if (srcSize == 0) {
      return uVar1;
    }
    ZSTD_findFrameSizeInfo(&frameSizeInfo,src,srcSize,ZSTD_f_zstd1);
    if (0xffffffffffffff88 < frameSizeInfo.compressedSize) break;
    src = (void *)((long)src + frameSizeInfo.compressedSize);
    srcSize = srcSize - frameSizeInfo.compressedSize;
    uVar1 = uVar1 + frameSizeInfo.decompressedBound;
    if (frameSizeInfo.decompressedBound == 0xfffffffffffffffe) {
      return 0xfffffffffffffffe;
    }
  }
  return 0xfffffffffffffffe;
}

Assistant:

unsigned long long ZSTD_decompressBound(const void* src, size_t srcSize)
{
    unsigned long long bound = 0;
    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize, ZSTD_f_zstd1);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ZSTD_CONTENTSIZE_ERROR;
        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
        bound += decompressedBound;
    }
    return bound;
}